

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9VmByteCodeExec(jx9_vm *pVm)

{
  jx9_vm *pVm_local;
  
  if (pVm->nMagic == 0xba851227) {
    pVm->nMagic = 0xcdfe1dad;
    VmByteCodeExec(pVm,(VmInstr *)pVm->pByteContainer->pBase,pVm->aOps,-1,&pVm->sExec);
    pVm_local._4_4_ = 0;
  }
  else {
    pVm_local._4_4_ = -0x18;
    if (pVm->nMagic == 0xcdfe1dad) {
      pVm_local._4_4_ = -4;
    }
  }
  return pVm_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmByteCodeExec(jx9_vm *pVm)
{
	/* Make sure we are ready to execute this program */
	if( pVm->nMagic != JX9_VM_RUN ){
		return pVm->nMagic == JX9_VM_EXEC ? SXERR_LOCKED /* Locked VM */ : SXERR_CORRUPT; /* Stale VM */
	}
	/* Set the execution magic number  */
	pVm->nMagic = JX9_VM_EXEC;
	/* Execute the program */
	VmByteCodeExec(&(*pVm), (VmInstr *)SySetBasePtr(pVm->pByteContainer), pVm->aOps, -1, &pVm->sExec);
	/*
	 * TICKET 1433-100: Do not remove the JX9_VM_EXEC magic number
	 * so that any following call to [jx9_vm_exec()] without calling
	 * [jx9_vm_reset()] first would fail.
	 */
	return SXRET_OK;
}